

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::CopyImage::FunctionalTest::iterate(FunctionalTest *this)

{
  targetDesc *desc_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  GLuint GVar7;
  IterateResult IVar8;
  undefined4 extraout_var;
  uint uVar9;
  GLenum extraout_EDX;
  ulong uVar10;
  GLuint i_2;
  GLuint i;
  testCase *test_case;
  long lVar11;
  GLubyte *src_pixels [3];
  GLubyte *dst_pixels [3];
  targetDesc desc;
  GLubyte *local_1e8 [4];
  GLubyte *local_1c8 [4];
  undefined1 local_1a8 [8];
  GLuint GStack_1a0;
  GLuint GStack_19c;
  GLenum GStack_198;
  undefined8 uStack_194;
  ios_base local_130 [264];
  
  local_1c8[0] = (GLubyte *)0x0;
  local_1c8[1] = (GLubyte *)0x0;
  local_1c8[2] = (GLubyte *)0x0;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  local_1e8[2] = (GLubyte *)0x0;
  local_1e8[0] = (GLubyte *)0x0;
  local_1e8[1] = (GLubyte *)0x0;
  test_case = (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_test_case_index;
  (**(code **)(lVar11 + 0xff0))(0xd05,1);
  (**(code **)(lVar11 + 0xff0))(0xcf5,1);
  err = (**(code **)(lVar11 + 0x800))();
  glu::checkError(err,"PixelStorei",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xaa8);
  prepareDstPxls(this,&test_case->m_dst,local_1c8);
  desc_00 = &test_case->m_src;
  prepareSrcPxls(this,desc_00,extraout_EDX,local_1e8);
  GVar7 = prepareTexture(this,&test_case->m_dst,local_1c8,&this->m_dst_buf_name);
  this->m_dst_tex_name = GVar7;
  if (desc_00->m_target == 0x8d41) {
    uVar1 = desc_00->m_width;
    uVar2 = (test_case->m_src).m_height;
    uVar3 = (test_case->m_src).m_level;
    uVar4 = (test_case->m_src).m_internal_format;
    uStack_194._0_4_ = (test_case->m_src).m_format;
    uStack_194._4_4_ = (test_case->m_src).m_type;
    local_1a8._4_4_ = uVar1;
    local_1a8._0_4_ = 0xde1;
    GStack_1a0 = uVar2;
    GStack_19c = uVar3;
    GStack_198 = uVar4;
    GVar7 = prepareTexture(this,desc_00,local_1e8,&this->m_src_buf_name);
    this->m_rb_name = GVar7;
    GVar7 = prepareTexture(this,(targetDesc *)local_1a8,local_1e8,&this->m_src_buf_name);
  }
  else {
    GVar7 = prepareTexture(this,desc_00,local_1e8,&this->m_src_buf_name);
  }
  this->m_src_tex_name = GVar7;
  bVar5 = copyAndVerify(this,test_case,local_1c8,local_1e8);
  clean(this);
  lVar11 = 0;
  do {
    if (local_1c8[lVar11] != (GLubyte *)0x0) {
      operator_delete__(local_1c8[lVar11]);
      local_1c8[lVar11] = (GLubyte *)0x0;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    if (local_1e8[lVar11] != (GLubyte *)0x0) {
      operator_delete__(local_1e8[lVar11]);
      local_1e8[lVar11] = (GLubyte *)0x0;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (bVar5) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar9 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar9;
    uVar10 = ((long)(this->m_test_cases).
                    super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_test_cases).
                    super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    IVar8 = (IterateResult)(uVar9 <= uVar10 && uVar10 - uVar9 != 0);
  }
  else {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&GStack_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&GStack_1a0,"Failure. ",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&GStack_1a0);
    std::ios_base::~ios_base(local_130);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar8 = STOP;
  }
  return IVar8;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	GLubyte*					 dst_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const Functions&			 gl									  = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result							  = tcu::TestNode::STOP;
	bool						 result								  = false;
	GLubyte*					 src_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const testCase&				 test_case							  = m_test_cases[m_test_case_index];

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PixelStorei");

	try
	{
		/* Prepare pixels */
		prepareDstPxls(test_case.m_dst, dst_pixels);
		prepareSrcPxls(test_case.m_src, test_case.m_dst.m_internal_format, src_pixels);

		/* Prepare textures */
		m_dst_tex_name = prepareTexture(test_case.m_dst, (const GLubyte**)dst_pixels, m_dst_buf_name);

		if (GL_RENDERBUFFER == test_case.m_src.m_target)
		{
			targetDesc desc = test_case.m_src;
			desc.m_target   = GL_TEXTURE_2D;

			m_rb_name	  = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
			m_src_tex_name = prepareTexture(desc, (const GLubyte**)src_pixels, m_src_buf_name);
		}
		else
		{
			m_src_tex_name = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
		}

		/* Copy images and verify results */
		result = copyAndVerify(test_case, (const GLubyte**)dst_pixels, (const GLubyte**)src_pixels);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		cleanPixels((GLubyte**)dst_pixels);
		cleanPixels((GLubyte**)src_pixels);
		throw exc;
	}

	/* Free resources */
	clean();
	cleanPixels((GLubyte**)dst_pixels);
	cleanPixels((GLubyte**)src_pixels);

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failure. " << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}